

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O1

void Helpers::WriteOutputPNG
               (string *path,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,uint width,
               uint bufferHeight,double gamma,double colorScale)

{
  uchar uVar1;
  int iVar2;
  pointer puVar3;
  FILE *__stream;
  __jmp_buf_tag *__env;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  png_structp png_ptr;
  uint local_9c;
  png_infop info_ptr;
  uint local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  double local_78;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rows;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pngData;
  
  local_80 = gamma;
  local_78 = colorScale;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&pngData,(ulong)(width * bufferHeight * 6),(allocator_type *)&rows);
  uVar7 = bufferHeight * 2;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            (&rows,(ulong)uVar7,(allocator_type *)&png_ptr);
  iVar2 = width * 3;
  if (uVar7 != 0) {
    uVar4 = 0;
    uVar8 = 0;
    do {
      rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] =
           pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar4;
      uVar8 = uVar8 + 1;
      uVar4 = uVar4 + iVar2;
    } while (uVar7 != uVar8);
  }
  puVar3 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  if (lVar5 == 0) {
    local_9c = 1;
  }
  else {
    local_9c = 1;
    uVar8 = 0;
    do {
      uVar4 = puVar3[uVar8];
      if (uVar4 < local_9c) {
        uVar4 = local_9c;
      }
      local_9c = uVar4;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < (ulong)(lVar5 >> 2));
  }
  puVar3 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3;
  local_8c = bufferHeight;
  local_88 = uVar7;
  local_84 = width;
  if (lVar5 != 0) {
    uVar8 = lVar5 >> 2;
    dVar12 = local_80 + -1.0;
    dVar10 = local_78 + -1.0;
    uVar4 = local_9c >> 1;
    uVar9 = (ulong)local_9c;
    uVar7 = 1;
    uVar6 = 0;
    do {
      if (ABS(dVar10) <= 0.0001 && ABS(dVar12) <= 0.0001) {
        uVar1 = (uchar)((puVar3[uVar6] * 0xff + uVar4) / local_9c);
      }
      else {
        dVar11 = ((double)puVar3[uVar6] * local_78) / (double)uVar9;
        if (1.0 <= dVar11) {
          dVar11 = 1.0;
        }
        dVar11 = pow(dVar11,local_80);
        uVar1 = (uchar)(int)(dVar11 * 255.0);
        uVar8 = (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 2;
      }
      pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6 + uVar8] = uVar1;
      uVar6 = (ulong)uVar7;
      puVar3 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
      uVar7 = uVar7 + 1;
    } while (uVar6 < uVar8);
  }
  uVar4 = local_84;
  uVar7 = local_88;
  if (local_8c != 0) {
    uVar8 = 0;
    do {
      if (local_84 != 0) {
        uVar9 = 0;
        do {
          rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8][uVar9] =
               rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[~(uint)uVar8 + local_88][uVar9];
          uVar9 = uVar9 + 1;
        } while (iVar2 + (uint)(iVar2 == 0) != uVar9);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_8c);
  }
  __stream = fopen((path->_M_dataplus)._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to open image.png for writing.",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    png_ptr = (png_structp)png_create_write_struct("1.6.37",0,0);
    if (png_ptr != (png_structp)0x0) {
      info_ptr = (png_infop)png_create_info_struct(png_ptr);
      if (info_ptr == (png_infop)0x0) {
        png_destroy_write_struct(&png_ptr,0);
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(png_ptr,longjmp,200);
        iVar2 = _setjmp(__env);
        if (iVar2 == 0) {
          png_init_io(png_ptr,__stream);
          png_set_IHDR(png_ptr,info_ptr,uVar4,uVar7,8,2,0,0,0);
          png_write_info(png_ptr,info_ptr);
          png_write_image(png_ptr,rows.
                                  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          png_write_end(png_ptr,info_ptr);
        }
        png_destroy_write_struct(&png_ptr,&info_ptr);
      }
    }
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pngData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteOutputPNG(const std::string &path, const std::vector<uint32_t>& data, unsigned int width, unsigned int bufferHeight, double gamma, double colorScale)
    {
        std::vector<png_byte> pngData(3*width*2*bufferHeight);
        std::vector<png_byte *> rows{2*bufferHeight};
        for(unsigned int i = 0; i < 2*bufferHeight ; ++i)
        {
            rows[i] = pngData.data()+3*width*i;
        }

        uint32_t maxValue{UINT32_C(1)};
        for(unsigned int i = 0; i < data.size();++i)
        {
            maxValue = std::max(maxValue,data[i]);
        }
        for(unsigned int i = 0; i < data.size();++i)
        {
            if(fabs(gamma - 1.0) > 0.0001 || fabs(colorScale - 1.0) > 0.0001)
            {
                pngData[data.size() + i] = static_cast<png_byte>(255.0 * pow(std::min(1.0,colorScale*static_cast<double>(data[i])/static_cast<double>(maxValue)),gamma));
            }
            else
            {
                pngData[data.size() + i] = (255*data[i] + (maxValue/2))/maxValue;
            }
        }
        for(unsigned int i = 0; i < bufferHeight;++i)
        {
            for(unsigned int j = 0; j < width*3;++j)
            {
                rows[i][j] =rows[2*bufferHeight-i-1][j];
            }
        }

        ScopedCFileDescriptor fd(path.c_str(), "wb");
        if(!fd.IsValid())
        {
            std::cerr << "Failed to open image.png for writing." << std::endl;
            return;
        }
        png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
        if(!png_ptr)
        {
            return;
        }
        png_infop info_ptr = png_create_info_struct(png_ptr);
        if(!info_ptr)
        {
            png_destroy_write_struct(&png_ptr, (png_infopp)NULL);
            return;
        }
        if(setjmp(png_jmpbuf(png_ptr)))
        {
            png_destroy_write_struct(&png_ptr, &info_ptr);
            return;
        }
        png_init_io(png_ptr, fd.Get());
        png_set_IHDR(png_ptr, info_ptr, width, 2*bufferHeight, 8, PNG_COLOR_TYPE_RGB, PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

        png_write_info(png_ptr, info_ptr);
        //header written.

        png_write_image(png_ptr, rows.data());

        png_write_end(png_ptr, info_ptr);
        png_destroy_write_struct(&png_ptr, &info_ptr);
    }